

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

bool mkvparser::Match(IMkvReader *pReader,longlong *pos,unsigned_long expected_id,longlong *val)

{
  int iVar1;
  longlong lVar2;
  IMkvReader *in_RCX;
  longlong in_RDX;
  IMkvReader *in_RSI;
  long *in_RDI;
  longlong size;
  longlong id;
  long len;
  long status;
  longlong available;
  longlong total;
  long *len_00;
  longlong pos_00;
  
  if ((in_RDI != (long *)0x0) && (-1 < (long)in_RSI->_vptr_IMkvReader)) {
    pos_00 = 0;
    len_00 = (long *)0x0;
    iVar1 = (**(code **)(*in_RDI + 8))(in_RDI,&stack0xffffffffffffffd0,&stack0xffffffffffffffc8);
    if (((-1 < iVar1) &&
        (((pos_00 < 0 || ((long)len_00 <= pos_00)) &&
         (lVar2 = ReadID(in_RSI,in_RDX,(long *)in_RCX), -1 < lVar2)))) &&
       (((long)len_00 - (long)in_RSI->_vptr_IMkvReader < 1 && (lVar2 == in_RDX)))) {
      in_RSI->_vptr_IMkvReader = in_RSI->_vptr_IMkvReader;
      ReadUInt(in_RCX,pos_00,len_00);
    }
  }
  return false;
}

Assistant:

bool Match(IMkvReader* pReader, long long& pos, unsigned long expected_id,
           long long& val) {
  if (!pReader || pos < 0)
    return false;

  long long total = 0;
  long long available = 0;

  const long status = pReader->Length(&total, &available);
  if (status < 0 || (total >= 0 && available > total))
    return false;

  long len = 0;

  const long long id = ReadID(pReader, pos, len);
  if (id < 0 || (available - pos) > len)
    return false;

  if (static_cast<unsigned long>(id) != expected_id)
    return false;

  pos += len;  // consume id

  const long long size = ReadUInt(pReader, pos, len);
  if (size < 0 || size > 8 || len < 1 || len > 8 || (available - pos) > len)
    return false;

  pos += len;  // consume length of size of payload

  val = UnserializeUInt(pReader, pos, size);
  if (val < 0)
    return false;

  pos += size;  // consume size of payload

  return true;
}